

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O0

State * __thiscall re2::DFA::StateSaver::Restore(StateSaver *this)

{
  ostream *poVar1;
  long in_RDI;
  State *s;
  MutexLock l;
  Mutex *in_stack_fffffffffffffe38;
  MutexLock *in_stack_fffffffffffffe40;
  LogMessage *in_stack_fffffffffffffe50;
  int in_stack_fffffffffffffe74;
  char *in_stack_fffffffffffffe78;
  LogMessage *in_stack_fffffffffffffe80;
  uint32_t in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  int *in_stack_fffffffffffffed0;
  DFA *in_stack_fffffffffffffed8;
  State *local_8;
  
  if ((*(byte *)(in_RDI + 0x18) & 1) == 0) {
    MutexLock::MutexLock(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    local_8 = CachedState(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                          in_stack_fffffffffffffecc,in_stack_fffffffffffffec8);
    if (local_8 == (State *)0x0) {
      LogMessage::LogMessage
                (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe74);
      poVar1 = LogMessage::stream((LogMessage *)&stack0xfffffffffffffe50);
      std::operator<<(poVar1,"StateSaver failed to restore state.");
      LogMessage::~LogMessage(in_stack_fffffffffffffe50);
    }
    MutexLock::~MutexLock((MutexLock *)0x225900);
  }
  else {
    local_8 = *(State **)(in_RDI + 0x20);
  }
  return local_8;
}

Assistant:

DFA::State* DFA::StateSaver::Restore() {
  if (is_special_)
    return special_;
  MutexLock l(&dfa_->mutex_);
  State* s = dfa_->CachedState(inst_, ninst_, flag_);
  if (s == NULL)
    LOG(DFATAL) << "StateSaver failed to restore state.";
  return s;
}